

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_check_mandatory_data
              (lyd_node *root,lyd_node *last_parent,ly_set *instances,lys_node *schema,int options)

{
  ushort uVar1;
  LYS_NODE LVar2;
  uint uVar3;
  ly_ctx *ctx;
  LY_ECODE ecode;
  int iVar4;
  lys_node *plVar5;
  lys_module *plVar6;
  char *pcVar7;
  
  ctx = schema->module->ctx;
  if (instances->number == 0) {
    uVar1 = schema->flags;
    plVar5 = lys_is_disabled(schema,2);
    if (((uint)options >> 0xd & 1) != 0) {
      return 0;
    }
    if (plVar5 != (lys_node *)0x0) {
      return 0;
    }
    if ((uVar1 & 0x30) != 0) {
      return 0;
    }
    if (((options & 0x10000ffU) != 0) && ((schema->flags & 2) != 0)) {
      return 0;
    }
    iVar4 = lyd_is_when_false(root,last_parent,schema,options);
    if (iVar4 != 0) {
      return 0;
    }
  }
  LVar2 = schema->nodetype;
  if (LVar2 == LYS_LEAF) {
LAB_001687c6:
    if ((schema->flags & 0x40) == 0) {
      return 0;
    }
    if (instances->number == 0) {
      pcVar7 = schema->name;
      if (last_parent == (lyd_node *)0x0) {
        plVar6 = lys_node_module(schema);
        plVar5 = (lys_node *)&plVar6->name;
      }
      else {
        plVar5 = last_parent->schema;
      }
      ly_vlog(ctx,LYE_MISSELEM,LY_VLOG_LYD,last_parent,pcVar7,plVar5->name);
      return 1;
    }
    return 0;
  }
  if (LVar2 == LYS_LEAFLIST) {
    if ((*(uint *)&schema[1].priv == 0) || (*(uint *)&schema[1].priv <= instances->number)) {
      uVar3 = *(uint *)((long)&schema[1].priv + 4);
LAB_001688aa:
      if ((ulong)uVar3 == 0) {
        return 0;
      }
      if (instances->number <= uVar3) {
        return 0;
      }
      last_parent = (lyd_node *)(instances->set).s[uVar3];
      pcVar7 = schema->name;
      ecode = LYE_NOMAX;
      goto LAB_001688c4;
    }
  }
  else {
    if (LVar2 != LYS_LIST) {
      if ((LVar2 != LYS_ANYDATA) && (LVar2 != LYS_ANYXML)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                      ,0x2a1,
                      "int lyd_check_mandatory_data(struct lyd_node *, struct lyd_node *, struct ly_set *, struct lys_node *, int)"
                     );
      }
      goto LAB_001687c6;
    }
    if ((*(uint *)&schema[1].iffeature == 0) || (*(uint *)&schema[1].iffeature <= instances->number)
       ) {
      uVar3 = *(uint *)((long)&schema[1].iffeature + 4);
      goto LAB_001688aa;
    }
  }
  pcVar7 = schema->name;
  ecode = LYE_NOMIN;
LAB_001688c4:
  ly_vlog(ctx,ecode,LY_VLOG_LYD,last_parent,pcVar7);
  return 1;
}

Assistant:

static int
lyd_check_mandatory_data(struct lyd_node *root, struct lyd_node *last_parent,
                         struct ly_set *instances, struct lys_node *schema, int options)
{
    struct ly_ctx *ctx = schema->module->ctx;
    uint32_t limit;
    uint16_t status;

    if (!instances->number) {
        /* no instance in the data tree - check if the instantiating is enabled
         * (check: if-feature, when, status data in non-status data tree)
         */
        status = (schema->flags & LYS_STATUS_MASK);
        if (lys_is_disabled(schema, 2) || (status && status != LYS_STATUS_CURR)) {
            /* disabled by if-feature */
            return EXIT_SUCCESS;
        } else if ((options & LYD_OPT_TRUSTED) || ((options & LYD_OPT_TYPEMASK) && (schema->flags & LYS_CONFIG_R))) {
            /* status schema node in non-status data tree */
            return EXIT_SUCCESS;
        } else if (lyd_is_when_false(root, last_parent, schema, options)) {
            return EXIT_SUCCESS;
        }
        /* the schema instance is not disabled by anything, continue with checking */
    }

    /* checking various mandatory conditions */
    switch (schema->nodetype) {
    case LYS_LEAF:
    case LYS_ANYXML:
    case LYS_ANYDATA:
        /* mandatory */
        if ((schema->flags & LYS_MAND_TRUE) && !instances->number) {
            LOGVAL(ctx, LYE_MISSELEM, LY_VLOG_LYD, last_parent, schema->name,
                   last_parent ? last_parent->schema->name : lys_node_module(schema)->name);
            return EXIT_FAILURE;
        }
        break;
    case LYS_LIST:
        /* min-elements */
        limit = ((struct lys_node_list *)schema)->min;
        if (limit && limit > instances->number) {
            LOGVAL(ctx, LYE_NOMIN, LY_VLOG_LYD, last_parent, schema->name);
            return EXIT_FAILURE;
        }
        /* max elements */
        limit = ((struct lys_node_list *)schema)->max;
        if (limit && limit < instances->number) {
            LOGVAL(ctx, LYE_NOMAX, LY_VLOG_LYD, instances->set.d[limit], schema->name);
            return EXIT_FAILURE;
        }

        break;

    case LYS_LEAFLIST:
        /* min-elements */
        limit = ((struct lys_node_leaflist *)schema)->min;
        if (limit && limit > instances->number) {
            LOGVAL(ctx, LYE_NOMIN, LY_VLOG_LYD, last_parent, schema->name);
            return EXIT_FAILURE;
        }
        /* max elements */
        limit = ((struct lys_node_leaflist *)schema)->max;
        if (limit && limit < instances->number) {
            LOGVAL(ctx, LYE_NOMAX, LY_VLOG_LYD, instances->set.d[limit], schema->name);
            return EXIT_FAILURE;
        }
        break;
    default:
        /* we cannot get here */
        assert(0);
        break;
    }

    return EXIT_SUCCESS;
}